

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

int_type __thiscall fmt::v7::detail::formatbuf<char>::overflow(formatbuf<char> *this,int_type ch)

{
  bool bVar1;
  int_type in_ESI;
  buffer<char> *in_RDI;
  char *in_stack_ffffffffffffffd8;
  int_type local_10;
  int_type local_c [3];
  
  local_c[0] = in_ESI;
  local_10 = Catch::clara::std::char_traits<char>::eof();
  bVar1 = Catch::clara::std::char_traits<char>::eq_int_type(local_c,&local_10);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    buffer<char>::push_back(in_RDI,in_stack_ffffffffffffffd8);
  }
  return local_c[0];
}

Assistant:

int_type overflow(int_type ch = traits_type::eof()) FMT_OVERRIDE {
    if (!traits_type::eq_int_type(ch, traits_type::eof()))
      buffer_.push_back(static_cast<Char>(ch));
    return ch;
  }